

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::unicodeReplacement(string *unit_string)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__pos;
  char *pcVar1;
  byte *pbVar2;
  reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t codelength;
  size_type fnd;
  value_type *ucode;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::pair<const_char_*,_const_char_*>,_66UL> *__range1;
  bool changed;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  pointer in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  bool local_9;
  
  local_9 = false;
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::array<std::pair<const_char_*,_const_char_*>,_66UL>::begin
                   ((array<std::pair<const_char_*,_const_char_*>,_66UL> *)0x6cbbb6);
  __pos = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::array<std::pair<const_char_*,_const_char_*>,_66UL>::end
                    ((array<std::pair<const_char_*,_const_char_*>,_66UL> *)0x6cbbc7);
LAB_006cbbcc:
  if (this == __pos) {
    return local_9;
  }
  this_00 = this;
  pcVar1 = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find(this,in_stack_ffffffffffffffc8,(size_type)in_stack_ffffffffffffffc0);
LAB_006cbc01:
  do {
    if (pcVar1 == (char *)0xffffffffffffffff) break;
    in_stack_ffffffffffffffc0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         strlen((this->_M_dataplus)._M_p);
    if ((in_stack_ffffffffffffffc0 ==
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1) &&
       (pcVar1 != (char *)0x0)) {
      pbVar2 = (byte *)CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 (in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
      if (0xc0 < *pbVar2) {
        pcVar1 = (char *)std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                   (this,pcVar1,(size_type)in_stack_ffffffffffffffc0);
        goto LAB_006cbc01;
      }
    }
    local_9 = true;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (size_type)__pos,(size_type)this,pcVar1);
    if (pcVar1 != (char *)0x0) {
      pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
      if (*pvVar3 == '\\') {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8,
                   (size_type)in_stack_ffffffffffffffb0);
        pcVar1 = pcVar1 + -1;
      }
    }
    in_stack_ffffffffffffffa8 = pcVar1;
    in_stack_ffffffffffffffb8 = (this->_M_dataplus)._M_p;
    in_stack_ffffffffffffffb0 = in_RDI;
    pcVar1 = in_stack_ffffffffffffffa8;
    strlen((char *)this->_M_string_length);
    pcVar1 = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::find(this,pcVar1,(size_type)in_stack_ffffffffffffffc0);
  } while( true );
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this_00->field_2;
  in_stack_ffffffffffffffc8 = (char *)0xffffffffffffffff;
  goto LAB_006cbbcc;
}

Assistant:

static bool unicodeReplacement(std::string& unit_string)
{
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 66>
        ucodeReplacements{{
            ckpair{u8"\u00d7", "*"},
            ckpair{u8"\u00f7", "/"},  // division sign
            ckpair{u8"\u00b7", "*"},
            ckpair{u8"\u2217", "*"},  // asterisk operator
            ckpair{u8"\u00B5", "u"},
            ckpair{u8"\u03BC", "u"},
            ckpair{u8"\u00E9", "e"},
            ckpair{u8"\u00E8", "e"},
            ckpair{u8"\u0301", ""},  // just get rid of the accent
            ckpair{u8"\u0300", ""},  // just get rid of the accent
            ckpair{u8"\u2212", "-"},
            ckpair{u8"\u2009", ""},  // thin space
            ckpair{u8"\u2007", ""},  // thin space
            ckpair{u8"\u202f", ""},  // narrow no break space
            ckpair{u8"\u207B\u00B9", "^(-1)"},
            ckpair{u8"\u207B\u00B2", "^(-2)"},
            ckpair{u8"\u207B\u00B3", "^(-3)"},
            ckpair{u8"\u207B\u2074", "^(-4)"},
            ckpair{u8"\u207B\u2075", "^(-5)"},
            ckpair{u8"\u207B\u2076", "^(-6)"},
            ckpair{u8"\u207B\u2077", "^(-7)"},
            ckpair{u8"\u207B\u2078", "^(-8)"},
            ckpair{u8"\u207B\u2079", "^(-9)"},
            ckpair{u8"-\u00B9", "^(-1)"},
            ckpair{u8"-\u00B2", "^(-2)"},
            ckpair{u8"-\u00B3", "^(-3)"},
            ckpair{u8"-\u2074", "^(-4)"},
            ckpair{u8"-\u2075", "^(-5)"},
            ckpair{u8"-\u2076", "^(-6)"},
            ckpair{u8"-\u2077", "^(-7)"},
            ckpair{u8"-\u2078", "^(-8)"},
            ckpair{u8"-\u2079", "^(-9)"},
            ckpair{u8"\u00b9", "*"},  // superscript 1 which doesn't do
                                      // anything
            ckpair{u8"\u00b2", "^(2)"},
            ckpair{u8"\u00b3", "^(3)"},
            ckpair{u8"\u2074", "^(4)"},
            ckpair{u8"\u2075", "^(5)"},
            ckpair{u8"\u2076", "^(6)"},
            ckpair{u8"\u2077", "^(7)"},
            ckpair{u8"\u2078", "^(8)"},
            ckpair{u8"\u2079", "^(9)"},
            ckpair{u8"\u2215", "/"},  // Division slash
            ckpair{u8"\u00BD", "(0.5)"},  // (1/2) fraction
            ckpair{u8"\u00BC", "(0.25)"},  // (1/4) fraction
            ckpair{u8"\u00BE", "(0.75)"},  // (3/4) fraction
            ckpair{u8"\u2153", "(1/3)"},  // (1/3) fraction
            ckpair{u8"\u2154", "(2/3)"},  // (2/3) fraction
            ckpair{u8"\u215B", "0.125"},  // (1/8) fraction
            ckpair{u8"\u215F", "1/"},  // 1/ numerator operator
            ckpair{u8"\u20AC", "\x80"},  // euro sign to extended ascii
            ckpair{u8"\u20BD", "ruble"},  // Ruble sign
            ckpair{u8"\u01B7", "dr_ap"},  // drachm symbol
            ckpair{"-\xb3", "^(-3)"},
            ckpair{"-\xb9", "^(-1)"},
            ckpair{"-\xb2", "^(-2)"},
            ckpair{"\xb3", "^(3)"},
            ckpair{"\xb9", "*"},
            // superscript 1 which doesn't do anything, replace with
            // multiply
            ckpair{"\xb2", "^(2)"},
            ckpair{"\xf7", "/"},
            ckpair{"\xB7", "*"},
            ckpair{"\xD7", "*"},
            ckpair{"\xE9", "e"},  // remove accent
            ckpair{"\xE8", "e"},  // remove accent
            ckpair{"\xBD", "(0.5)"},  // (1/2) fraction
            ckpair{"\xBC", "(0.25)"},  // (1/4) fraction
            ckpair{"\xBE", "(0.75)"},  // (3/4) fraction
        }};
    bool changed{false};
    for (const auto& ucode : ucodeReplacements) {
        auto fnd = unit_string.find(ucode.first);
        while (fnd != std::string::npos) {
            std::size_t codelength = strlen(ucode.first);
            if (codelength == 1 && fnd > 0 &&
                static_cast<unsigned char>(unit_string[fnd - 1]) > 0xC0) {
                // skip the conversion in this case as it is likely a unicode
                // sequence
                fnd = unit_string.find(ucode.first, fnd + 1);
                continue;
            }
            changed = true;
            unit_string.replace(fnd, codelength, ucode.second);
            if (fnd > 0 && unit_string[fnd - 1] == '\\') {
                unit_string.erase(fnd - 1, 1);
                --fnd;
            }
            fnd = unit_string.find(ucode.first, fnd + strlen(ucode.second));
        }
    }
    return changed;
}